

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Instance_Iterator::Next(Am_Instance_Iterator *this)

{
  uint *puVar1;
  Am_Object_Data *this_00;
  Am_Object_Data *pAVar2;
  
  pAVar2 = (this->current).data;
  if ((pAVar2 == (Am_Object_Data *)0x0) || ((pAVar2->data).data == (char *)0x0)) {
    pAVar2 = (this->prototype).data;
    if ((pAVar2 == (Am_Object_Data *)0x0) || ((pAVar2->data).data == (char *)0x0)) {
      return;
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    this_00 = Am_Object_Data::Narrow(&pAVar2->super_Am_Wrapper);
    pAVar2 = this_00->first_instance;
  }
  else {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    this_00 = Am_Object_Data::Narrow(&pAVar2->super_Am_Wrapper);
    pAVar2 = this_00->next_instance;
  }
  if (pAVar2 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  Am_Object::operator=(&this->current,pAVar2);
  Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  return;
}

Assistant:

void
Am_Instance_Iterator::Next()
{
  if (current.Valid()) {
    Am_Object_Data *curr_data = Am_Object_Data::Narrow(current);
    if (curr_data->next_instance)
      curr_data->next_instance->Note_Reference();
    current = curr_data->next_instance;
    curr_data->Release();
  } else if (prototype.Valid()) {
    Am_Object_Data *proto_data = Am_Object_Data::Narrow(prototype);
    if (proto_data->first_instance)
      proto_data->first_instance->Note_Reference();
    current = proto_data->first_instance;
    proto_data->Release();
  }
}